

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

Vec_Ptr_t * Bac_PtrTransformNtk(Vec_Ptr_t *vNtk,Vec_Ptr_t *vGatesNames)

{
  uint uVar1;
  char *__s;
  Vec_Ptr_t *vSig;
  Vec_Ptr_t *vBoxes;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t sVar4;
  char *__dest;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  
  uVar1 = vNtk->nSize;
  if ((((0 < (long)(int)uVar1) && (uVar1 != 1)) && (2 < uVar1)) && (4 < uVar1)) {
    ppvVar3 = vNtk->pArray;
    __s = (char *)*ppvVar3;
    pVVar5 = (Vec_Ptr_t *)ppvVar3[1];
    vSig = (Vec_Ptr_t *)ppvVar3[2];
    vBoxes = (Vec_Ptr_t *)ppvVar3[4];
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nCap = uVar1;
    ppvVar3 = (void **)malloc((long)(int)uVar1 << 3);
    pVVar2->pArray = ppvVar3;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar4 = strlen(__s);
      __dest = (char *)malloc(sVar4 + 1);
      strcpy(__dest,__s);
    }
    *ppvVar3 = __dest;
    pVVar5 = Bac_PtrTransformSigs(pVVar5);
    ppvVar3[1] = pVVar5;
    pVVar5 = Bac_PtrTransformSigs(vSig);
    ppvVar3[2] = pVVar5;
    pvVar6 = calloc(1,0x10);
    ppvVar3 = pVVar2->pArray;
    ppvVar3[3] = pvVar6;
    pVVar5 = Bac_PtrTransformBoxes(vBoxes,vGatesNames);
    pVVar2->nSize = 5;
    ppvVar3[4] = pVVar5;
    return pVVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformNtk( Vec_Ptr_t * vNtk, Vec_Ptr_t * vGatesNames )
{
    char * pName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4);
    Vec_Ptr_t * vNew     = Vec_PtrAllocExact( Vec_PtrSize(vNtk) );
    Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    Vec_PtrPush( vNew, Bac_PtrTransformSigs(vInputs) );
    Vec_PtrPush( vNew, Bac_PtrTransformSigs(vOutputs) );
    Vec_PtrPush( vNew, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNew, Bac_PtrTransformBoxes(vBoxes, vGatesNames) );
    return vNew;
}